

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_pack_nvlist_up(uchar *ptr,size_t *leftp)

{
  if (*leftp < 0x13) {
    __assert_fail("*leftp >= sizeof(nvphdr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x1a8,"unsigned char *nvpair_pack_nvlist_up(unsigned char *, size_t *)");
  }
  *ptr = 0xff;
  ptr[1] = '\x01';
  ptr[2] = '\0';
  ptr[3] = '\0';
  ptr[4] = '\0';
  ptr[5] = '\0';
  ptr[6] = '\0';
  ptr[7] = '\0';
  ptr[8] = '\0';
  ptr[9] = '\0';
  ptr[10] = '\0';
  ptr[0xb] = '\0';
  ptr[0xc] = '\0';
  ptr[0xd] = '\0';
  ptr[0xe] = '\0';
  ptr[0xf] = '\0';
  ptr[0x10] = '\0';
  ptr[0x11] = '\0';
  ptr[0x12] = '\0';
  *leftp = *leftp - 0x13;
  if (*leftp != 0) {
    ptr[0x13] = '\0';
    *leftp = *leftp - 1;
    return ptr + 0x14;
  }
  __assert_fail("*leftp >= namesize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x1ad,"unsigned char *nvpair_pack_nvlist_up(unsigned char *, size_t *)");
}

Assistant:

unsigned char *
nvpair_pack_nvlist_up(unsigned char *ptr, size_t *leftp)
{
	struct nvpair_header nvphdr;
	size_t namesize;
	const char *name = "";

	namesize = 1;
	nvphdr.nvph_type = NV_TYPE_NVLIST_UP;
	nvphdr.nvph_namesize = namesize;
	nvphdr.nvph_datasize = 0;
	nvphdr.nvph_nitems = 0;
	PJDLOG_ASSERT(*leftp >= sizeof(nvphdr));
	memcpy(ptr, &nvphdr, sizeof(nvphdr));
	ptr += sizeof(nvphdr);
	*leftp -= sizeof(nvphdr);

	PJDLOG_ASSERT(*leftp >= namesize);
	memcpy(ptr, name, namesize);
	ptr += namesize;
	*leftp -= namesize;

	return (ptr);
}